

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcViewportArrayTests.cpp
# Opt level: O3

bool __thiscall
glcts::ViewportArray::DepthRangeDepthTest::checkResults
          (DepthRangeDepthTest *this,texture *texture_0,texture *param_2,GLuint draw_call_index)

{
  ostringstream *this_00;
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  float fVar4;
  vector<float,_std::allocator<float>_> texture_data;
  float local_1c4;
  float local_1c0;
  vector<float,_std::allocator<float>_> local_1b8;
  undefined1 local_198 [120];
  ios_base local_120 [264];
  
  local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (float *)0x0;
  local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<float,_std::allocator<float>_>::resize(&local_1b8,0x20);
  Utils::texture::get(texture_0,0x1903,0x1406,
                      local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start);
  fVar4 = (float)draw_call_index * 0.0625;
  local_1c0 = *local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
  local_1c4 = local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start[0x10];
  bVar3 = false;
  if ((local_1c0 < fVar4) && (local_1c4 < fVar4)) {
    uVar1 = 0;
    do {
      uVar2 = uVar1;
      if (uVar2 == 0xf) {
        bVar3 = true;
        goto LAB_00ddc535;
      }
      local_1c0 = local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar2 + 1];
      local_1c4 = local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar2 + 0x11];
    } while ((local_1c0 < fVar4) && (uVar1 = uVar2 + 1, local_1c4 < fVar4));
    bVar3 = 0xe < uVar2;
  }
  local_198._0_8_ = ((this->super_DrawTestBase).super_TestCaseBase.m_context)->m_testCtx->m_log;
  this_00 = (ostringstream *)(local_198 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Invalid values at ",0x12);
  std::ostream::_M_insert<unsigned_long>((ulong)this_00);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," depth value ",0xd);
  std::ostream::_M_insert<double>((double)fVar4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," got [",6);
  std::ostream::_M_insert<double>((double)local_1c0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
  std::ostream::_M_insert<double>((double)local_1c4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"]",1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base(local_120);
  if (local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (float *)0x0) {
LAB_00ddc535:
    operator_delete(local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return bVar3;
}

Assistant:

bool DepthRangeDepthTest::checkResults(Utils::texture& texture_0, Utils::texture& /* texture_1 */,
									   GLuint		   draw_call_index)
{
	static const GLfloat step = 1.0f / 16.0f;

	const GLfloat depth_value = step * (GLfloat)draw_call_index;

	bool check_result = true;

	std::vector<GLfloat> texture_data;
	texture_data.resize(m_r32f_width * m_r32f_height);
	texture_0.get(GL_RED, GL_FLOAT, &texture_data[0]);

	for (GLuint i = 0; i < 16; ++i)
	{
		/* Bottom row should contain near values, top one should contain far values */
		const GLfloat near = texture_data[i];
		const GLfloat far  = texture_data[i + 16];

		if ((depth_value <= near) || (depth_value <= far))
		{
			m_context.getTestContext().getLog() << tcu::TestLog::Message << "Invalid values at " << i << " depth value "
												<< depth_value << " got [" << near << ", " << far << "]"
												<< tcu::TestLog::EndMessage;

			check_result = false;
			break;
		}
	}

	return check_result;
}